

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

void __thiscall QTzTimeZonePrivate::QTzTimeZonePrivate(QTzTimeZonePrivate *this,QByteArray *ianaId)

{
  undefined1 *puVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QByteArray *pQVar6;
  bool bVar7;
  int iVar8;
  qint64 forMSecsSinceEpoch;
  QTzTimeZonePrivate *this_00;
  long in_FS_OFFSET;
  QString local_108;
  QByteArray local_e8;
  QTzTimeZoneCacheEntry local_c8;
  Data local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  QTimeZonePrivate::QTimeZonePrivate(&this->super_QTimeZonePrivate);
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QTzTimeZonePrivate_0069f720;
  (this->cached_data).m_hasDst = false;
  (this->cached_data).m_tranTimes.d.d = (Data *)0x0;
  (this->cached_data).m_tranTimes.d.ptr = (QTzTransitionTime *)0x0;
  (this->cached_data).m_tranTimes.d.size = 0;
  (this->cached_data).m_tranRules.d.d = (Data *)0x0;
  (this->cached_data).m_tranRules.d.ptr = (QTzTransitionRule *)0x0;
  (this->cached_data).m_tranRules.d.size = 0;
  (this->cached_data).m_abbreviations.d.d = (Data *)0x0;
  (this->cached_data).m_abbreviations.d.ptr = (QByteArray *)0x0;
  (this->cached_data).m_abbreviations.d.size = 0;
  (this->cached_data).m_posixRule.d.d = (Data *)0x0;
  (this->cached_data).m_posixRule.d.ptr = (char *)0x0;
  (this->cached_data).m_posixRule.d.size = 0;
  *(undefined8 *)((long)&(this->cached_data).m_posixRule.d.size + 1) = 0;
  *(undefined8 *)((long)&(this->cached_data).m_preZoneRule.stdOffset + 1) = 0;
  bVar7 = isTimeZoneIdAvailable(this_00,ianaId);
  if (bVar7) {
    if (QTzTimeZonePrivate(QByteArray_const&)::tzCache == '\0') {
      iVar8 = __cxa_guard_acquire(&QTzTimeZonePrivate(QByteArray_const&)::tzCache);
      if (iVar8 != 0) {
        QTzTimeZoneCache::QTzTimeZoneCache(&QTzTimeZonePrivate::tzCache);
        __cxa_atexit(QTzTimeZoneCache::~QTzTimeZoneCache,&QTzTimeZonePrivate::tzCache,&__dso_handle)
        ;
        __cxa_guard_release(&QTzTimeZonePrivate(QByteArray_const&)::tzCache);
      }
    }
    local_c8.m_preZoneRule._0_5_ = 0xaaaaaaaaaa;
    local_c8.m_preZoneRule.dstOffset._1_3_ = 0xaaaaaa;
    local_c8.m_preZoneRule.abbreviationIndex = 0xaa;
    local_c8.m_preZoneRule._9_3_ = 0xaaaaaa;
    local_c8.m_hasDst = true;
    local_c8._109_3_ = 0xaaaaaa;
    local_c8.m_posixRule.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_posixRule.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_abbreviations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_posixRule.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_abbreviations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_abbreviations.d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranRules.d.ptr = (QTzTransitionRule *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranRules.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranTimes.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranRules.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranTimes.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_tranTimes.d.ptr = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    QTzTimeZoneCache::fetchEntry(&local_c8,&QTzTimeZonePrivate::tzCache,ianaId);
    if (((undefined1 *)local_c8.m_tranTimes.d.size != (undefined1 *)0x0) ||
       ((undefined1 *)local_c8.m_posixRule.d.size != (undefined1 *)0x0)) {
      QArrayDataPointer<QTzTransitionTime>::operator=
                ((QArrayDataPointer<QTzTransitionTime> *)&this->cached_data,
                 (QArrayDataPointer<QTzTransitionTime> *)&local_c8);
      QArrayDataPointer<QTzTransitionRule>::operator=
                (&(this->cached_data).m_tranRules.d,&local_c8.m_tranRules.d);
      qVar4 = local_c8.m_abbreviations.d.size;
      pQVar6 = local_c8.m_abbreviations.d.ptr;
      pDVar5 = local_c8.m_abbreviations.d.d;
      local_c8.m_abbreviations.d.size = 0;
      local_c8.m_abbreviations.d.d = (Data *)0x0;
      local_c8.m_abbreviations.d.ptr = (QByteArray *)0x0;
      local_58.abbreviation.d.d = (Data *)(this->cached_data).m_abbreviations.d.d;
      local_58.abbreviation.d.ptr = (char16_t *)(this->cached_data).m_abbreviations.d.ptr;
      (this->cached_data).m_abbreviations.d.d = pDVar5;
      (this->cached_data).m_abbreviations.d.ptr = pQVar6;
      local_58.abbreviation.d.size = (this->cached_data).m_abbreviations.d.size;
      (this->cached_data).m_abbreviations.d.size = qVar4;
      QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_58);
      pQVar2 = &((this->cached_data).m_posixRule.d.d)->super_QArrayData;
      pcVar3 = (this->cached_data).m_posixRule.d.ptr;
      (this->cached_data).m_posixRule.d.d = local_c8.m_posixRule.d.d;
      (this->cached_data).m_posixRule.d.ptr = local_c8.m_posixRule.d.ptr;
      puVar1 = (undefined1 *)(this->cached_data).m_posixRule.d.size;
      (this->cached_data).m_posixRule.d.size = local_c8.m_posixRule.d.size;
      *(ulong *)((long)&(this->cached_data).m_preZoneRule.dstOffset + 1) =
           CONCAT53(local_c8._104_5_,local_c8.m_preZoneRule.dstOffset._1_3_);
      (this->cached_data).m_preZoneRule.stdOffset = local_c8.m_preZoneRule.stdOffset;
      (this->cached_data).m_preZoneRule.dstOffset =
           (int)(CONCAT35(local_c8.m_preZoneRule.dstOffset._1_3_,local_c8.m_preZoneRule._0_5_) >>
                0x20);
      local_c8.m_posixRule.d.d = (Data *)pQVar2;
      local_c8.m_posixRule.d.ptr = pcVar3;
      local_c8.m_posixRule.d.size = (qsizetype)puVar1;
      QByteArray::operator=(&(this->super_QTimeZonePrivate).m_id,ianaId);
      if ((this->super_QTimeZonePrivate).m_id.d.size == 0) {
        forMSecsSinceEpoch = QDateTime::currentMSecsSinceEpoch();
        data(&local_58,this,forMSecsSinceEpoch);
        local_108.d.d = local_58.abbreviation.d.d;
        local_108.d.ptr = local_58.abbreviation.d.ptr;
        local_108.d.size = local_58.abbreviation.d.size;
        QString::toUtf8_helper(&local_e8,&local_108);
        pQVar2 = &((this->super_QTimeZonePrivate).m_id.d.d)->super_QArrayData;
        pcVar3 = (this->super_QTimeZonePrivate).m_id.d.ptr;
        (this->super_QTimeZonePrivate).m_id.d.d = local_e8.d.d;
        (this->super_QTimeZonePrivate).m_id.d.ptr = local_e8.d.ptr;
        qVar4 = (this->super_QTimeZonePrivate).m_id.d.size;
        (this->super_QTimeZonePrivate).m_id.d.size = local_e8.d.size;
        local_e8.d.d = (Data *)pQVar2;
        local_e8.d.ptr = pcVar3;
        local_e8.d.size = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,1,0x10);
          }
        }
        if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (&(local_c8.m_posixRule.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.m_posixRule.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.m_posixRule.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_c8.m_posixRule.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_c8.m_posixRule.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c8.m_abbreviations.d);
    if (&(local_c8.m_tranRules.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.m_tranRules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.m_tranRules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_c8.m_tranRules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_c8.m_tranRules.d.d)->super_QArrayData,0xc,0x10);
      }
    }
    if (&(local_c8.m_tranTimes.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.m_tranTimes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.m_tranTimes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_c8.m_tranTimes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_c8.m_tranTimes.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZonePrivate::QTzTimeZonePrivate(const QByteArray &ianaId)
{
    if (!isTimeZoneIdAvailable(ianaId)) // Avoid pointlessly creating cache entries
        return;
    static QTzTimeZoneCache tzCache;
    auto entry = tzCache.fetchEntry(ianaId);
    if (entry.m_tranTimes.isEmpty() && entry.m_posixRule.isEmpty())
        return; // Invalid after all !

    cached_data = std::move(entry);
    m_id = ianaId;
    // Avoid empty ID, if we have an abbreviation to use instead
    if (m_id.isEmpty()) {
        // This can only happen for the system zone, when we've read the
        // contents of /etc/localtime because it wasn't a symlink.
        // TODO: use CLDR generic abbreviation for the zone.
        m_id = abbreviation(QDateTime::currentMSecsSinceEpoch()).toUtf8();
    }
}